

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool __thiscall cfd::core::Psbt::IsFinalized(Psbt *this)

{
  CfdException *this_00;
  allocator local_45;
  int ret;
  size_t data;
  undefined1 local_38 [32];
  
  data = 0;
  ret = wally_psbt_is_finalized((wally_psbt *)this->wally_psbt_pointer_,&data);
  if (ret == 0) {
    return data == 1;
  }
  local_38._0_8_ = "cfdcore_psbt.cpp";
  local_38._8_4_ = 0x802;
  local_38._16_8_ = "IsFinalized";
  logger::warn<int&>((CfdSourceLocation *)local_38,"wally_psbt_is_finalized NG[{}]",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"psbt check finalized error.",&local_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool Psbt::IsFinalized() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t data = 0;
  int ret = wally_psbt_is_finalized(psbt_pointer, &data);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_is_finalized NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt check finalized error.");
  }
  return (data == 1);
}